

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void drain_en(int n)

{
  int n_local;
  
  if (u.uenmax != 0) {
    pline("You feel your magical energy drain away!");
    u.uen = u.uen - n;
    if (u.uen < 0) {
      u.uenmax = u.uen + u.uenmax;
      if (u.uenmax < 0) {
        u.uenmax = 0;
      }
      u.uen = 0;
    }
    iflags.botl = '\x01';
  }
  return;
}

Assistant:

void drain_en(int n)
{
	if (!u.uenmax) return;
	pline("You feel your magical energy drain away!");
	u.uen -= n;
	if (u.uen < 0)  {
		u.uenmax += u.uen;
		if (u.uenmax < 0) u.uenmax = 0;
		u.uen = 0;
	}
	iflags.botl = 1;
}